

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

bool __thiscall cmGraphVizWriter::TargetTypeEnabled(cmGraphVizWriter *this,TargetType targetType)

{
  undefined1 uVar1;
  
  uVar1 = 0;
  switch(targetType) {
  case EXECUTABLE:
    uVar1 = this->GenerateForExecutables;
    break;
  case STATIC_LIBRARY:
    return this->GenerateForStaticLibs;
  case SHARED_LIBRARY:
    return this->GenerateForSharedLibs;
  case MODULE_LIBRARY:
    return this->GenerateForModuleLibs;
  case OBJECT_LIBRARY:
    return this->GenerateForObjectLibs;
  case UTILITY:
    return this->GenerateForCustomTargets;
  case INTERFACE_LIBRARY:
    return this->GenerateForInterfaceLibs;
  case UNKNOWN_LIBRARY:
    return this->GenerateForUnknownLibs;
  }
  return (bool)uVar1;
}

Assistant:

bool cmGraphVizWriter::TargetTypeEnabled(
  cmStateEnums::TargetType targetType) const
{
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      return this->GenerateForExecutables;
    case cmStateEnums::STATIC_LIBRARY:
      return this->GenerateForStaticLibs;
    case cmStateEnums::SHARED_LIBRARY:
      return this->GenerateForSharedLibs;
    case cmStateEnums::MODULE_LIBRARY:
      return this->GenerateForModuleLibs;
    case cmStateEnums::INTERFACE_LIBRARY:
      return this->GenerateForInterfaceLibs;
    case cmStateEnums::OBJECT_LIBRARY:
      return this->GenerateForObjectLibs;
    case cmStateEnums::UNKNOWN_LIBRARY:
      return this->GenerateForUnknownLibs;
    case cmStateEnums::UTILITY:
      return this->GenerateForCustomTargets;
    case cmStateEnums::GLOBAL_TARGET:
      // Built-in targets like edit_cache, etc.
      // We don't need/want those in the dot file.
      return false;
    default:
      break;
  }
  return false;
}